

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_create_helper
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *seckey_scalar,
              secp256k1_ge *p,uchar *seckey)

{
  uint uVar1;
  uint uVar2;
  int vflag;
  unsigned_long _zzq_result;
  secp256k1_gej pj;
  secp256k1_gej local_c8;
  
  uVar1 = secp256k1_scalar_set_b32_seckey(seckey_scalar,seckey);
  local_c8.x.n[0] = 0x4d430005;
  local_c8.x.n[2] = 4;
  local_c8.x.n[3] = 0;
  local_c8.x.n[4] = 0;
  local_c8.x.magnitude = 0;
  local_c8.x.normalized = 0;
  uVar2 = (uVar1 ^ 1) & 1 | (uVar1 ^ 1) - 1 & *seckey_scalar;
  *seckey_scalar = uVar2;
  local_c8.x.n[1] = (uint64_t)seckey_scalar;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar2);
  secp256k1_ecmult_gen(ecmult_gen_ctx,&local_c8,seckey_scalar);
  secp256k1_ge_set_gej(p,&local_c8);
  return uVar1;
}

Assistant:

static int secp256k1_ec_pubkey_create_helper(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *seckey_scalar, secp256k1_ge *p, const unsigned char *seckey) {
    secp256k1_gej pj;
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(seckey_scalar, seckey);
    secp256k1_scalar_cmov(seckey_scalar, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(ecmult_gen_ctx, &pj, seckey_scalar);
    secp256k1_ge_set_gej(p, &pj);
    return ret;
}